

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *ridx,int *rn,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  int *piVar19;
  byte bVar20;
  cpp_dec_float<200U,_int,_void> local_4b8;
  cpp_dec_float<200U,_int,_void> local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar20 = 0;
  local_4b8.fpclass = cpp_dec_float_finite;
  local_4b8.prec_elem = 0x1c;
  local_4b8.data._M_elems[0] = 0;
  local_4b8.data._M_elems[1] = 0;
  local_4b8.data._M_elems[2] = 0;
  local_4b8.data._M_elems[3] = 0;
  local_4b8.data._M_elems[4] = 0;
  local_4b8.data._M_elems[5] = 0;
  local_4b8.data._M_elems[6] = 0;
  local_4b8.data._M_elems[7] = 0;
  local_4b8.data._M_elems[8] = 0;
  local_4b8.data._M_elems[9] = 0;
  local_4b8.data._M_elems[10] = 0;
  local_4b8.data._M_elems[0xb] = 0;
  local_4b8.data._M_elems[0xc] = 0;
  local_4b8.data._M_elems[0xd] = 0;
  local_4b8.data._M_elems[0xe] = 0;
  local_4b8.data._M_elems[0xf] = 0;
  local_4b8.data._M_elems[0x10] = 0;
  local_4b8.data._M_elems[0x11] = 0;
  local_4b8.data._M_elems[0x12] = 0;
  local_4b8.data._M_elems[0x13] = 0;
  local_4b8.data._M_elems[0x14] = 0;
  local_4b8.data._M_elems[0x15] = 0;
  local_4b8.data._M_elems[0x16] = 0;
  local_4b8.data._M_elems[0x17] = 0;
  local_4b8.data._M_elems[0x18] = 0;
  local_4b8.data._M_elems[0x19] = 0;
  local_4b8.data._M_elems._104_5_ = 0;
  local_4b8.data._M_elems[0x1b]._1_3_ = 0;
  local_4b8.exp = 0;
  local_4b8.neg = false;
  pnVar4 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->l).idx;
  piVar6 = (this->l).row;
  piVar7 = (this->l).start;
  uVar1 = (this->l).firstUpdate;
  uVar11 = 0;
  uVar14 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar14 = uVar11;
  }
  for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
    iVar2 = piVar6[uVar11];
    lVar10 = 0x1c;
    pnVar16 = vec + iVar2;
    pcVar17 = &local_4b8;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar17->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_4b8.exp = vec[iVar2].m_backend.exp;
    local_4b8.neg = vec[iVar2].m_backend.neg;
    local_4b8.fpclass = vec[iVar2].m_backend.fpclass;
    local_4b8.prec_elem = vec[iVar2].m_backend.prec_elem;
    pnVar16 = vec + iVar2;
    pnVar18 = &local_230;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    pnVar16 = eps;
    pnVar18 = &local_b0;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = (eps->m_backend).exp;
    local_b0.m_backend.neg = (eps->m_backend).neg;
    local_b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    local_230.m_backend.exp = local_4b8.exp;
    local_230.m_backend.neg = local_4b8.neg;
    local_230.m_backend.fpclass = local_4b8.fpclass;
    local_230.m_backend.prec_elem = local_4b8.prec_elem;
    bVar8 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_230,&local_b0);
    if (bVar8) {
      iVar2 = piVar7[uVar11];
      piVar19 = piVar5 + iVar2;
      pcVar17 = &pnVar4[iVar2].m_backend;
      for (iVar12 = piVar7[uVar11 + 1]; iVar2 < iVar12; iVar12 = iVar12 + -1) {
        iVar13 = *piVar19;
        piVar19 = piVar19 + 1;
        local_3b8.fpclass = cpp_dec_float_finite;
        local_3b8.prec_elem = 0x1c;
        local_3b8.data._M_elems[0] = 0;
        local_3b8.data._M_elems[1] = 0;
        local_3b8.data._M_elems[2] = 0;
        local_3b8.data._M_elems[3] = 0;
        local_3b8.data._M_elems[4] = 0;
        local_3b8.data._M_elems[5] = 0;
        local_3b8.data._M_elems[6] = 0;
        local_3b8.data._M_elems[7] = 0;
        local_3b8.data._M_elems[8] = 0;
        local_3b8.data._M_elems[9] = 0;
        local_3b8.data._M_elems[10] = 0;
        local_3b8.data._M_elems[0xb] = 0;
        local_3b8.data._M_elems[0xc] = 0;
        local_3b8.data._M_elems[0xd] = 0;
        local_3b8.data._M_elems[0xe] = 0;
        local_3b8.data._M_elems[0xf] = 0;
        local_3b8.data._M_elems[0x10] = 0;
        local_3b8.data._M_elems[0x11] = 0;
        local_3b8.data._M_elems[0x12] = 0;
        local_3b8.data._M_elems[0x13] = 0;
        local_3b8.data._M_elems[0x14] = 0;
        local_3b8.data._M_elems[0x15] = 0;
        local_3b8.data._M_elems[0x16] = 0;
        local_3b8.data._M_elems[0x17] = 0;
        local_3b8.data._M_elems[0x18] = 0;
        local_3b8.data._M_elems[0x19] = 0;
        local_3b8.data._M_elems._104_5_ = 0;
        local_3b8.data._M_elems[0x1b]._1_3_ = 0;
        local_3b8.exp = 0;
        local_3b8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_3b8,&local_4b8,pcVar17);
        updateSolutionVectorLright
                  (this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_3b8,iVar13,vec + iVar13,ridx,rn);
        pcVar17 = pcVar17 + 1;
      }
    }
  }
  if ((this->l).updateType != 0) {
    iVar2 = (this->l).firstUnused;
    while ((long)uVar14 < (long)iVar2) {
      iVar12 = piVar7[uVar14];
      piVar19 = piVar5 + iVar12;
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum(&tmp);
      uVar11 = uVar14 + 1;
      pcVar17 = &pnVar4[iVar12].m_backend;
      for (iVar13 = piVar7[uVar14 + 1]; iVar12 < iVar13; iVar13 = iVar13 + -1) {
        iVar3 = *piVar19;
        piVar19 = piVar19 + 1;
        local_438.fpclass = cpp_dec_float_finite;
        local_438.prec_elem = 0x1c;
        local_438.data._M_elems[0] = 0;
        local_438.data._M_elems[1] = 0;
        local_438.data._M_elems[2] = 0;
        local_438.data._M_elems[3] = 0;
        local_438.data._M_elems[4] = 0;
        local_438.data._M_elems[5] = 0;
        local_438.data._M_elems[6] = 0;
        local_438.data._M_elems[7] = 0;
        local_438.data._M_elems[8] = 0;
        local_438.data._M_elems[9] = 0;
        local_438.data._M_elems[10] = 0;
        local_438.data._M_elems[0xb] = 0;
        local_438.data._M_elems[0xc] = 0;
        local_438.data._M_elems[0xd] = 0;
        local_438.data._M_elems[0xe] = 0;
        local_438.data._M_elems[0xf] = 0;
        local_438.data._M_elems[0x10] = 0;
        local_438.data._M_elems[0x11] = 0;
        local_438.data._M_elems[0x12] = 0;
        local_438.data._M_elems[0x13] = 0;
        local_438.data._M_elems[0x14] = 0;
        local_438.data._M_elems[0x15] = 0;
        local_438.data._M_elems[0x16] = 0;
        local_438.data._M_elems[0x17] = 0;
        local_438.data._M_elems[0x18] = 0;
        local_438.data._M_elems[0x19] = 0;
        local_438.data._M_elems._104_5_ = 0;
        local_438.data._M_elems[0x1b]._1_3_ = 0;
        local_438.exp = 0;
        local_438.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_438,&vec[iVar3].m_backend,pcVar17);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  ((cpp_dec_float<200U,_int,_void> *)&tmp,&local_438);
        pcVar17 = pcVar17 + 1;
      }
      iVar12 = piVar6[uVar14];
      lVar10 = 0x1c;
      pSVar15 = &tmp;
      pcVar17 = &local_4b8;
      for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar17->data)._M_elems[0] = (pSVar15->sum).m_backend.data._M_elems[0];
        pSVar15 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pSVar15 + ((ulong)bVar20 * -2 + 1) * 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_4b8.exp = tmp.sum.m_backend.exp;
      local_4b8.neg = tmp.sum.m_backend.neg;
      local_4b8.prec_elem = tmp.sum.m_backend.prec_elem;
      local_4b8.fpclass = tmp.sum.m_backend.fpclass;
      pSVar15 = &tmp;
      pnVar16 = &local_2b0;
      for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pSVar15->sum).m_backend.data._M_elems[0];
        pSVar15 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pSVar15 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = tmp.sum.m_backend.exp;
      local_2b0.m_backend.neg = tmp.sum.m_backend.neg;
      local_2b0.m_backend.fpclass = tmp.sum.m_backend.fpclass;
      local_2b0.m_backend.prec_elem = tmp.sum.m_backend.prec_elem;
      pnVar16 = eps;
      pnVar18 = &local_130;
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = (eps->m_backend).exp;
      local_130.m_backend.neg = (eps->m_backend).neg;
      local_130.m_backend.fpclass = (eps->m_backend).fpclass;
      local_130.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar8 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2b0,&local_130);
      uVar14 = uVar11;
      if (bVar8) {
        pcVar17 = &local_4b8;
        pnVar16 = &local_1b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar20 * -2 + 1) * 4)
          ;
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = local_4b8.exp;
        local_1b0.m_backend.neg = local_4b8.neg;
        local_1b0.m_backend.fpclass = local_4b8.fpclass;
        local_1b0.m_backend.prec_elem = local_4b8.prec_elem;
        updateSolutionVectorLright(this,&local_1b0,iVar12,vec + iVar12,ridx,rn);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright(R* vec, int* ridx, int& rn, R eps)
{
   int i, j, k, n;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      x = vec[lrow[i]];

      // check whether there is a corresponding value in the rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // apply \f$- x * L_{k,i}\f$ to all corresponding values in rhs/solution VectorBase<R>
         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp += vec[*idx++] * (*val++);
         }

         j = lrow[i];
         x = R(tmp);

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);
      }
   }
}